

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  float fVar38;
  float fVar39;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar51;
  float fVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar58;
  float fVar59;
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar71;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  float fVar72;
  float fVar73;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar74 [16];
  float fVar82;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar83;
  undefined1 auVar77 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  float fVar101;
  undefined1 auVar102 [16];
  float fVar109;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar107;
  float fVar108;
  undefined1 auVar106 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar115 [64];
  float fVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar120 [64];
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar125 [64];
  float fVar129;
  undefined1 auVar130 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [64];
  float fVar135;
  float fVar136;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar137 [16];
  float fVar143;
  undefined1 auVar138 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  UVIdentity<4> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_156d;
  int local_156c;
  undefined8 local_1568;
  float fStack_1560;
  float fStack_155c;
  undefined8 local_1558;
  float fStack_1550;
  float fStack_154c;
  undefined8 local_1548;
  float fStack_1540;
  float fStack_153c;
  Scene *local_1530;
  undefined1 local_1528 [16];
  undefined1 local_1518 [16];
  undefined1 local_1508 [16];
  undefined1 local_14f8 [16];
  undefined1 local_14e8 [16];
  undefined1 local_14d8 [16];
  long local_14c8;
  long local_14c0;
  undefined4 local_14b8;
  undefined4 local_14b4;
  undefined4 local_14b0;
  undefined4 local_14ac;
  undefined4 local_14a8;
  undefined4 local_14a4;
  uint local_14a0;
  uint local_149c;
  uint local_1498;
  RTCFilterFunctionNArguments local_1488;
  undefined1 local_1458 [16];
  undefined1 local_1448 [16];
  undefined1 local_1438 [16];
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 *local_13b8;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar2 = ray->tfar;
    if (0.0 <= fVar2) {
      puVar28 = local_11d0;
      aVar4 = (ray->dir).field_0;
      auVar41 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar69._8_4_ = 0x7fffffff;
      auVar69._0_8_ = 0x7fffffff7fffffff;
      auVar69._12_4_ = 0x7fffffff;
      auVar69 = vandps_avx((undefined1  [16])aVar4,auVar69);
      auVar84._8_4_ = 0x219392ef;
      auVar84._0_8_ = 0x219392ef219392ef;
      auVar84._12_4_ = 0x219392ef;
      auVar69 = vcmpps_avx(auVar69,auVar84,1);
      auVar85._8_4_ = 0x3f800000;
      auVar85._0_8_ = 0x3f8000003f800000;
      auVar85._12_4_ = 0x3f800000;
      auVar84 = vdivps_avx(auVar85,(undefined1  [16])aVar4);
      auVar86._8_4_ = 0x5d5e0b6b;
      auVar86._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar86._12_4_ = 0x5d5e0b6b;
      auVar69 = vblendvps_avx(auVar84,auVar86,auVar69);
      auVar74._0_4_ = auVar69._0_4_ * 0.99999964;
      auVar74._4_4_ = auVar69._4_4_ * 0.99999964;
      auVar74._8_4_ = auVar69._8_4_ * 0.99999964;
      auVar74._12_4_ = auVar69._12_4_ * 0.99999964;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      auVar100 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar106 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar113 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
      auVar60._0_4_ = auVar69._0_4_ * 1.0000004;
      auVar60._4_4_ = auVar69._4_4_ * 1.0000004;
      auVar60._8_4_ = auVar69._8_4_ * 1.0000004;
      auVar60._12_4_ = auVar69._12_4_ * 1.0000004;
      auVar69 = vshufps_avx(auVar74,auVar74,0);
      auVar115 = ZEXT3264(CONCAT1616(auVar69,auVar69));
      auVar69 = vmovshdup_avx(auVar74);
      auVar84 = vshufps_avx(auVar74,auVar74,0x55);
      auVar120 = ZEXT3264(CONCAT1616(auVar84,auVar84));
      auVar84 = vshufpd_avx(auVar74,auVar74,1);
      auVar85 = vshufps_avx(auVar74,auVar74,0xaa);
      auVar125 = ZEXT3264(CONCAT1616(auVar85,auVar85));
      auVar85 = vshufps_avx(auVar60,auVar60,0);
      auVar131 = ZEXT3264(CONCAT1616(auVar85,auVar85));
      uVar29 = (ulong)(auVar74._0_4_ < 0.0) << 5;
      auVar85 = vshufps_avx(auVar60,auVar60,0x55);
      auVar77 = ZEXT3264(CONCAT1616(auVar85,auVar85));
      auVar85 = vshufps_avx(auVar60,auVar60,0xaa);
      uVar27 = (ulong)(auVar69._0_4_ < 0.0) << 5 | 0x40;
      auVar70 = ZEXT3264(CONCAT1616(auVar85,auVar85));
      uVar30 = (ulong)(auVar84._0_4_ < 0.0) << 5 | 0x80;
      uVar31 = uVar29 ^ 0x20;
      auVar69 = vshufps_avx(auVar41,auVar41,0);
      auVar90 = ZEXT3264(CONCAT1616(auVar69,auVar69));
      auVar69 = vshufps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0);
      auVar94 = ZEXT3264(CONCAT1616(auVar69,auVar69));
      local_1458 = mm_lookupmask_ps._240_16_;
      do {
        uVar32 = puVar28[-1];
        puVar28 = puVar28 + -1;
        local_11f8 = auVar100._0_32_;
        local_1218 = auVar106._0_32_;
        local_1238 = auVar113._0_32_;
        while ((uVar32 & 8) == 0) {
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar29),local_11f8);
          auVar17._4_4_ = auVar115._4_4_ * auVar16._4_4_;
          auVar17._0_4_ = auVar115._0_4_ * auVar16._0_4_;
          auVar17._8_4_ = auVar115._8_4_ * auVar16._8_4_;
          auVar17._12_4_ = auVar115._12_4_ * auVar16._12_4_;
          auVar17._16_4_ = auVar115._16_4_ * auVar16._16_4_;
          auVar17._20_4_ = auVar115._20_4_ * auVar16._20_4_;
          auVar17._24_4_ = auVar115._24_4_ * auVar16._24_4_;
          auVar17._28_4_ = auVar16._28_4_;
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar27),local_1218);
          auVar18._4_4_ = auVar120._4_4_ * auVar16._4_4_;
          auVar18._0_4_ = auVar120._0_4_ * auVar16._0_4_;
          auVar18._8_4_ = auVar120._8_4_ * auVar16._8_4_;
          auVar18._12_4_ = auVar120._12_4_ * auVar16._12_4_;
          auVar18._16_4_ = auVar120._16_4_ * auVar16._16_4_;
          auVar18._20_4_ = auVar120._20_4_ * auVar16._20_4_;
          auVar18._24_4_ = auVar120._24_4_ * auVar16._24_4_;
          auVar18._28_4_ = auVar16._28_4_;
          auVar16 = vmaxps_avx(auVar17,auVar18);
          auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar30),local_1238);
          auVar19._4_4_ = auVar125._4_4_ * auVar17._4_4_;
          auVar19._0_4_ = auVar125._0_4_ * auVar17._0_4_;
          auVar19._8_4_ = auVar125._8_4_ * auVar17._8_4_;
          auVar19._12_4_ = auVar125._12_4_ * auVar17._12_4_;
          auVar19._16_4_ = auVar125._16_4_ * auVar17._16_4_;
          auVar19._20_4_ = auVar125._20_4_ * auVar17._20_4_;
          auVar19._24_4_ = auVar125._24_4_ * auVar17._24_4_;
          auVar19._28_4_ = auVar17._28_4_;
          auVar17 = vmaxps_avx(auVar19,auVar90._0_32_);
          auVar16 = vmaxps_avx(auVar16,auVar17);
          auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar31),local_11f8);
          auVar20._4_4_ = auVar131._4_4_ * auVar17._4_4_;
          auVar20._0_4_ = auVar131._0_4_ * auVar17._0_4_;
          auVar20._8_4_ = auVar131._8_4_ * auVar17._8_4_;
          auVar20._12_4_ = auVar131._12_4_ * auVar17._12_4_;
          auVar20._16_4_ = auVar131._16_4_ * auVar17._16_4_;
          auVar20._20_4_ = auVar131._20_4_ * auVar17._20_4_;
          auVar20._24_4_ = auVar131._24_4_ * auVar17._24_4_;
          auVar20._28_4_ = auVar17._28_4_;
          auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar27 ^ 0x20)),local_1218);
          auVar21._4_4_ = auVar77._4_4_ * auVar17._4_4_;
          auVar21._0_4_ = auVar77._0_4_ * auVar17._0_4_;
          auVar21._8_4_ = auVar77._8_4_ * auVar17._8_4_;
          auVar21._12_4_ = auVar77._12_4_ * auVar17._12_4_;
          auVar21._16_4_ = auVar77._16_4_ * auVar17._16_4_;
          auVar21._20_4_ = auVar77._20_4_ * auVar17._20_4_;
          auVar21._24_4_ = auVar77._24_4_ * auVar17._24_4_;
          auVar21._28_4_ = auVar17._28_4_;
          auVar17 = vminps_avx(auVar20,auVar21);
          auVar18 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar30 ^ 0x20)),local_1238);
          auVar22._4_4_ = auVar70._4_4_ * auVar18._4_4_;
          auVar22._0_4_ = auVar70._0_4_ * auVar18._0_4_;
          auVar22._8_4_ = auVar70._8_4_ * auVar18._8_4_;
          auVar22._12_4_ = auVar70._12_4_ * auVar18._12_4_;
          auVar22._16_4_ = auVar70._16_4_ * auVar18._16_4_;
          auVar22._20_4_ = auVar70._20_4_ * auVar18._20_4_;
          auVar22._24_4_ = auVar70._24_4_ * auVar18._24_4_;
          auVar22._28_4_ = auVar18._28_4_;
          auVar18 = vminps_avx(auVar22,auVar94._0_32_);
          auVar17 = vminps_avx(auVar17,auVar18);
          auVar16 = vcmpps_avx(auVar16,auVar17,2);
          uVar25 = vmovmskps_avx(auVar16);
          if (uVar25 == 0) goto LAB_002e5c12;
          uVar23 = uVar32 & 0xfffffffffffffff0;
          lVar24 = 0;
          if ((byte)uVar25 != 0) {
            for (; ((byte)uVar25 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
            }
          }
          uVar32 = *(ulong *)(uVar23 + lVar24 * 8);
          uVar25 = (uVar25 & 0xff) - 1 & uVar25 & 0xff;
          if (uVar25 != 0) {
            *puVar28 = uVar32;
            puVar28 = puVar28 + 1;
            lVar24 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
              }
            }
            uVar32 = *(ulong *)(uVar23 + lVar24 * 8);
            uVar25 = uVar25 - 1 & uVar25;
            uVar26 = (ulong)uVar25;
            if (uVar25 != 0) {
              do {
                *puVar28 = uVar32;
                puVar28 = puVar28 + 1;
                lVar24 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
                uVar32 = *(ulong *)(uVar23 + lVar24 * 8);
                uVar26 = uVar26 & uVar26 - 1;
              } while (uVar26 != 0);
            }
          }
        }
        local_14c8 = (ulong)((uint)uVar32 & 0xf) - 8;
        if (local_14c8 != 0) {
          uVar32 = uVar32 & 0xfffffffffffffff0;
          local_14c0 = 0;
          local_1258 = auVar115._0_32_;
          local_1278 = auVar120._0_32_;
          local_1298 = auVar125._0_32_;
          local_12b8 = auVar131._0_32_;
          local_12d8 = auVar77._0_32_;
          local_12f8 = auVar70._0_32_;
          local_1318 = auVar90._0_32_;
          local_1338 = auVar94._0_32_;
          local_1530 = context->scene;
          do {
            lVar24 = local_14c0 * 0x50;
            ppfVar5 = (local_1530->vertices).items;
            pfVar6 = ppfVar5[*(uint *)(uVar32 + 0x30 + lVar24)];
            pfVar7 = ppfVar5[*(uint *)(uVar32 + 0x34 + lVar24)];
            pfVar8 = ppfVar5[*(uint *)(uVar32 + 0x38 + lVar24)];
            pfVar9 = ppfVar5[*(uint *)(uVar32 + 0x3c + lVar24)];
            auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar32 + lVar24)),
                                    *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar32 + 8 + lVar24)))
            ;
            auVar69 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar32 + lVar24)),
                                    *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar32 + 8 + lVar24)))
            ;
            auVar85 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + 4 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar32 + 0xc + lVar24)));
            auVar84 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + 4 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar32 + 0xc + lVar24)));
            auVar74 = vunpcklps_avx(auVar69,auVar84);
            auVar86 = vunpcklps_avx(auVar41,auVar85);
            auVar69 = vunpckhps_avx(auVar41,auVar85);
            auVar85 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar32 + 0x10 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar32 + 0x18 + lVar24)));
            auVar84 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar32 + 0x10 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar32 + 0x18 + lVar24)));
            auVar60 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar32 + 0x14 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar32 + 0x1c + lVar24)));
            auVar41 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar32 + 0x14 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar32 + 0x1c + lVar24)));
            auVar42 = vunpcklps_avx(auVar84,auVar41);
            auVar33 = vunpcklps_avx(auVar85,auVar60);
            auVar84 = vunpckhps_avx(auVar85,auVar60);
            auVar60 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar32 + 0x20 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar32 + 0x28 + lVar24)));
            auVar41 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar32 + 0x20 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar32 + 0x28 + lVar24)));
            auVar34 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar32 + 0x24 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar32 + 0x2c + lVar24)));
            auVar85 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar32 + 0x24 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar32 + 0x2c + lVar24)));
            auVar52 = vunpcklps_avx(auVar41,auVar85);
            auVar85 = vunpcklps_avx(auVar60,auVar34);
            auVar60 = vunpckhps_avx(auVar60,auVar34);
            puVar1 = (undefined8 *)(uVar32 + 0x30 + lVar24);
            local_13f8 = *puVar1;
            uStack_13f0 = puVar1[1];
            puVar1 = (undefined8 *)(uVar32 + 0x40 + lVar24);
            local_1408 = *puVar1;
            uStack_1400 = puVar1[1];
            uVar3 = *(undefined4 *)&(ray->org).field_0;
            auVar110._4_4_ = uVar3;
            auVar110._0_4_ = uVar3;
            auVar110._8_4_ = uVar3;
            auVar110._12_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar130._4_4_ = uVar3;
            auVar130._0_4_ = uVar3;
            auVar130._8_4_ = uVar3;
            auVar130._12_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar137._4_4_ = uVar3;
            auVar137._0_4_ = uVar3;
            auVar137._8_4_ = uVar3;
            auVar137._12_4_ = uVar3;
            local_14d8 = vsubps_avx(auVar86,auVar110);
            local_14e8 = vsubps_avx(auVar69,auVar130);
            local_14f8 = vsubps_avx(auVar74,auVar137);
            auVar69 = vsubps_avx(auVar33,auVar110);
            auVar84 = vsubps_avx(auVar84,auVar130);
            auVar41 = vsubps_avx(auVar42,auVar137);
            auVar85 = vsubps_avx(auVar85,auVar110);
            auVar60 = vsubps_avx(auVar60,auVar130);
            auVar74 = vsubps_avx(auVar52,auVar137);
            local_1508 = vsubps_avx(auVar85,local_14d8);
            local_1518 = vsubps_avx(auVar60,local_14e8);
            local_1528 = vsubps_avx(auVar74,local_14f8);
            fVar2 = local_14e8._0_4_;
            fVar40 = auVar60._0_4_ + fVar2;
            fVar12 = local_14e8._4_4_;
            fVar48 = auVar60._4_4_ + fVar12;
            fVar58 = local_14e8._8_4_;
            fVar49 = auVar60._8_4_ + fVar58;
            fVar14 = local_14e8._12_4_;
            fVar50 = auVar60._12_4_ + fVar14;
            fVar114 = local_14f8._0_4_;
            fVar72 = fVar114 + auVar74._0_4_;
            fVar116 = local_14f8._4_4_;
            fVar78 = fVar116 + auVar74._4_4_;
            fVar117 = local_14f8._8_4_;
            fVar80 = fVar117 + auVar74._8_4_;
            fVar118 = local_14f8._12_4_;
            fVar82 = fVar118 + auVar74._12_4_;
            fVar51 = local_1528._0_4_;
            auVar102._0_4_ = fVar51 * fVar40;
            fVar57 = local_1528._4_4_;
            auVar102._4_4_ = fVar57 * fVar48;
            fVar38 = local_1528._8_4_;
            auVar102._8_4_ = fVar38 * fVar49;
            fVar39 = local_1528._12_4_;
            auVar102._12_4_ = fVar39 * fVar50;
            fVar145 = local_1518._0_4_;
            auVar111._0_4_ = fVar145 * fVar72;
            fVar146 = local_1518._4_4_;
            auVar111._4_4_ = fVar146 * fVar78;
            fVar147 = local_1518._8_4_;
            auVar111._8_4_ = fVar147 * fVar80;
            fVar148 = local_1518._12_4_;
            auVar111._12_4_ = fVar148 * fVar82;
            auVar86 = vsubps_avx(auVar111,auVar102);
            fVar11 = local_14d8._0_4_;
            fVar101 = auVar85._0_4_ + fVar11;
            fVar13 = local_14d8._4_4_;
            fVar107 = auVar85._4_4_ + fVar13;
            fVar59 = local_14d8._8_4_;
            fVar108 = auVar85._8_4_ + fVar59;
            fVar15 = local_14d8._12_4_;
            fVar109 = auVar85._12_4_ + fVar15;
            fVar135 = local_1508._0_4_;
            auVar75._0_4_ = fVar135 * fVar72;
            fVar139 = local_1508._4_4_;
            auVar75._4_4_ = fVar139 * fVar78;
            fVar141 = local_1508._8_4_;
            auVar75._8_4_ = fVar141 * fVar80;
            fVar143 = local_1508._12_4_;
            auVar75._12_4_ = fVar143 * fVar82;
            auVar112._0_4_ = fVar101 * fVar51;
            auVar112._4_4_ = fVar107 * fVar57;
            auVar112._8_4_ = fVar108 * fVar38;
            auVar112._12_4_ = fVar109 * fVar39;
            auVar42 = vsubps_avx(auVar112,auVar75);
            auVar103._0_4_ = fVar145 * fVar101;
            auVar103._4_4_ = fVar146 * fVar107;
            auVar103._8_4_ = fVar147 * fVar108;
            auVar103._12_4_ = fVar148 * fVar109;
            auVar33._0_4_ = fVar135 * fVar40;
            auVar33._4_4_ = fVar139 * fVar48;
            auVar33._8_4_ = fVar141 * fVar49;
            auVar33._12_4_ = fVar143 * fVar50;
            auVar33 = vsubps_avx(auVar33,auVar103);
            local_1558._4_4_ = (ray->dir).field_0.m128[2];
            local_1568._4_4_ = (ray->dir).field_0.m128[1];
            fStack_1540 = (ray->dir).field_0.m128[0];
            local_1548 = (RTCIntersectArguments *)CONCAT44(fStack_1540,fStack_1540);
            fStack_153c = fStack_1540;
            local_1428._0_4_ =
                 auVar86._0_4_ * fStack_1540 +
                 local_1568._4_4_ * auVar42._0_4_ + local_1558._4_4_ * auVar33._0_4_;
            local_1428._4_4_ =
                 auVar86._4_4_ * fStack_1540 +
                 local_1568._4_4_ * auVar42._4_4_ + local_1558._4_4_ * auVar33._4_4_;
            local_1428._8_4_ =
                 auVar86._8_4_ * fStack_1540 +
                 local_1568._4_4_ * auVar42._8_4_ + local_1558._4_4_ * auVar33._8_4_;
            local_1428._12_4_ =
                 auVar86._12_4_ * fStack_1540 +
                 local_1568._4_4_ * auVar42._12_4_ + local_1558._4_4_ * auVar33._12_4_;
            local_1418 = vsubps_avx(local_14e8,auVar84);
            auVar86 = vsubps_avx(local_14f8,auVar41);
            fVar40 = fVar2 + auVar84._0_4_;
            fVar48 = fVar12 + auVar84._4_4_;
            fVar49 = fVar58 + auVar84._8_4_;
            fVar50 = fVar14 + auVar84._12_4_;
            fVar72 = fVar114 + auVar41._0_4_;
            fVar78 = fVar116 + auVar41._4_4_;
            fVar80 = fVar117 + auVar41._8_4_;
            fVar82 = fVar118 + auVar41._12_4_;
            fVar119 = auVar86._0_4_;
            auVar138._0_4_ = fVar119 * fVar40;
            fVar121 = auVar86._4_4_;
            auVar138._4_4_ = fVar121 * fVar48;
            fVar122 = auVar86._8_4_;
            auVar138._8_4_ = fVar122 * fVar49;
            fVar123 = auVar86._12_4_;
            auVar138._12_4_ = fVar123 * fVar50;
            fVar129 = local_1418._0_4_;
            auVar61._0_4_ = fVar129 * fVar72;
            fVar132 = local_1418._4_4_;
            auVar61._4_4_ = fVar132 * fVar78;
            fVar133 = local_1418._8_4_;
            auVar61._8_4_ = fVar133 * fVar80;
            fVar134 = local_1418._12_4_;
            auVar61._12_4_ = fVar134 * fVar82;
            auVar86 = vsubps_avx(auVar61,auVar138);
            auVar42 = vsubps_avx(local_14d8,auVar69);
            fVar136 = auVar42._0_4_;
            auVar76._0_4_ = fVar136 * fVar72;
            fVar140 = auVar42._4_4_;
            auVar76._4_4_ = fVar140 * fVar78;
            fVar142 = auVar42._8_4_;
            auVar76._8_4_ = fVar142 * fVar80;
            fVar144 = auVar42._12_4_;
            auVar76._12_4_ = fVar144 * fVar82;
            fVar72 = fVar11 + auVar69._0_4_;
            fVar78 = fVar13 + auVar69._4_4_;
            fVar80 = fVar59 + auVar69._8_4_;
            fVar82 = fVar15 + auVar69._12_4_;
            auVar104._0_4_ = fVar119 * fVar72;
            auVar104._4_4_ = fVar121 * fVar78;
            auVar104._8_4_ = fVar122 * fVar80;
            auVar104._12_4_ = fVar123 * fVar82;
            auVar42 = vsubps_avx(auVar104,auVar76);
            auVar95._0_4_ = fVar129 * fVar72;
            auVar95._4_4_ = fVar132 * fVar78;
            auVar95._8_4_ = fVar133 * fVar80;
            auVar95._12_4_ = fVar134 * fVar82;
            auVar34._0_4_ = fVar136 * fVar40;
            auVar34._4_4_ = fVar140 * fVar48;
            auVar34._8_4_ = fVar142 * fVar49;
            auVar34._12_4_ = fVar144 * fVar50;
            auVar33 = vsubps_avx(auVar34,auVar95);
            local_13d8._0_4_ =
                 fStack_1540 * auVar86._0_4_ +
                 local_1568._4_4_ * auVar42._0_4_ + local_1558._4_4_ * auVar33._0_4_;
            local_13d8._4_4_ =
                 fStack_1540 * auVar86._4_4_ +
                 local_1568._4_4_ * auVar42._4_4_ + local_1558._4_4_ * auVar33._4_4_;
            local_13d8._8_4_ =
                 fStack_1540 * auVar86._8_4_ +
                 local_1568._4_4_ * auVar42._8_4_ + local_1558._4_4_ * auVar33._8_4_;
            local_13d8._12_4_ =
                 fStack_1540 * auVar86._12_4_ +
                 local_1568._4_4_ * auVar42._12_4_ + local_1558._4_4_ * auVar33._12_4_;
            auVar86 = vsubps_avx(auVar69,auVar85);
            fVar107 = auVar85._0_4_ + auVar69._0_4_;
            fVar108 = auVar85._4_4_ + auVar69._4_4_;
            fVar109 = auVar85._8_4_ + auVar69._8_4_;
            fVar71 = auVar85._12_4_ + auVar69._12_4_;
            auVar69 = vsubps_avx(auVar84,auVar60);
            fVar78 = auVar84._0_4_ + auVar60._0_4_;
            fVar80 = auVar84._4_4_ + auVar60._4_4_;
            fVar82 = auVar84._8_4_ + auVar60._8_4_;
            fVar101 = auVar84._12_4_ + auVar60._12_4_;
            auVar84 = vsubps_avx(auVar41,auVar74);
            fVar48 = auVar41._0_4_ + auVar74._0_4_;
            fVar49 = auVar41._4_4_ + auVar74._4_4_;
            fVar50 = auVar41._8_4_ + auVar74._8_4_;
            fVar72 = auVar41._12_4_ + auVar74._12_4_;
            fVar73 = auVar84._0_4_;
            auVar87._0_4_ = fVar73 * fVar78;
            fVar79 = auVar84._4_4_;
            auVar87._4_4_ = fVar79 * fVar80;
            fVar81 = auVar84._8_4_;
            auVar87._8_4_ = fVar81 * fVar82;
            fVar83 = auVar84._12_4_;
            auVar87._12_4_ = fVar83 * fVar101;
            fVar124 = auVar69._0_4_;
            auVar96._0_4_ = fVar124 * fVar48;
            fVar126 = auVar69._4_4_;
            auVar96._4_4_ = fVar126 * fVar49;
            fVar127 = auVar69._8_4_;
            auVar96._8_4_ = fVar127 * fVar50;
            fVar128 = auVar69._12_4_;
            auVar96._12_4_ = fVar128 * fVar72;
            auVar69 = vsubps_avx(auVar96,auVar87);
            fVar40 = auVar86._0_4_;
            auVar41._0_4_ = fVar40 * fVar48;
            fVar48 = auVar86._4_4_;
            auVar41._4_4_ = fVar48 * fVar49;
            fVar49 = auVar86._8_4_;
            auVar41._8_4_ = fVar49 * fVar50;
            fVar50 = auVar86._12_4_;
            auVar41._12_4_ = fVar50 * fVar72;
            auVar97._0_4_ = fVar73 * fVar107;
            auVar97._4_4_ = fVar79 * fVar108;
            auVar97._8_4_ = fVar81 * fVar109;
            auVar97._12_4_ = fVar83 * fVar71;
            auVar84 = vsubps_avx(auVar97,auVar41);
            auVar62._0_4_ = fVar124 * fVar107;
            auVar62._4_4_ = fVar126 * fVar108;
            auVar62._8_4_ = fVar127 * fVar109;
            auVar62._12_4_ = fVar128 * fVar71;
            auVar52._0_4_ = fVar40 * fVar78;
            auVar52._4_4_ = fVar48 * fVar80;
            auVar52._8_4_ = fVar49 * fVar82;
            auVar52._12_4_ = fVar50 * fVar101;
            auVar41 = vsubps_avx(auVar52,auVar62);
            local_1558._0_4_ = local_1558._4_4_;
            fStack_1550 = local_1558._4_4_;
            fStack_154c = local_1558._4_4_;
            local_1568._0_4_ = local_1568._4_4_;
            fStack_1560 = local_1568._4_4_;
            fStack_155c = local_1568._4_4_;
            auVar42._0_4_ =
                 fStack_1540 * auVar69._0_4_ +
                 local_1568._4_4_ * auVar84._0_4_ + local_1558._4_4_ * auVar41._0_4_;
            auVar42._4_4_ =
                 fStack_1540 * auVar69._4_4_ +
                 local_1568._4_4_ * auVar84._4_4_ + local_1558._4_4_ * auVar41._4_4_;
            auVar42._8_4_ =
                 fStack_1540 * auVar69._8_4_ +
                 local_1568._4_4_ * auVar84._8_4_ + local_1558._4_4_ * auVar41._8_4_;
            auVar42._12_4_ =
                 fStack_1540 * auVar69._12_4_ +
                 local_1568._4_4_ * auVar84._12_4_ + local_1558._4_4_ * auVar41._12_4_;
            local_13c8._0_4_ = auVar42._0_4_ + local_1428._0_4_ + local_13d8._0_4_;
            local_13c8._4_4_ = auVar42._4_4_ + local_1428._4_4_ + local_13d8._4_4_;
            local_13c8._8_4_ = auVar42._8_4_ + local_1428._8_4_ + local_13d8._8_4_;
            local_13c8._12_4_ = auVar42._12_4_ + local_1428._12_4_ + local_13d8._12_4_;
            auVar69 = vminps_avx(local_1428,local_13d8);
            auVar69 = vminps_avx(auVar69,auVar42);
            auVar63._8_4_ = 0x7fffffff;
            auVar63._0_8_ = 0x7fffffff7fffffff;
            auVar63._12_4_ = 0x7fffffff;
            local_1438 = vandps_avx(local_13c8,auVar63);
            auVar64._0_4_ = local_1438._0_4_ * 1.1920929e-07;
            auVar64._4_4_ = local_1438._4_4_ * 1.1920929e-07;
            auVar64._8_4_ = local_1438._8_4_ * 1.1920929e-07;
            auVar64._12_4_ = local_1438._12_4_ * 1.1920929e-07;
            uVar23 = CONCAT44(auVar64._4_4_,auVar64._0_4_);
            auVar88._0_8_ = uVar23 ^ 0x8000000080000000;
            auVar88._8_4_ = -auVar64._8_4_;
            auVar88._12_4_ = -auVar64._12_4_;
            auVar69 = vcmpps_avx(auVar69,auVar88,5);
            auVar84 = vmaxps_avx(local_1428,local_13d8);
            auVar84 = vmaxps_avx(auVar84,auVar42);
            auVar84 = vcmpps_avx(auVar84,auVar64,2);
            local_1448 = vorps_avx(auVar69,auVar84);
            local_156d = 0;
            auVar69 = local_1458 & local_1448;
            if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar69[0xf] < '\0') {
              auVar43._0_4_ = fVar129 * fVar51;
              auVar43._4_4_ = fVar132 * fVar57;
              auVar43._8_4_ = fVar133 * fVar38;
              auVar43._12_4_ = fVar134 * fVar39;
              auVar53._0_4_ = fVar145 * fVar119;
              auVar53._4_4_ = fVar146 * fVar121;
              auVar53._8_4_ = fVar147 * fVar122;
              auVar53._12_4_ = fVar148 * fVar123;
              auVar41 = vsubps_avx(auVar53,auVar43);
              auVar65._0_4_ = fVar119 * fVar124;
              auVar65._4_4_ = fVar121 * fVar126;
              auVar65._8_4_ = fVar122 * fVar127;
              auVar65._12_4_ = fVar123 * fVar128;
              auVar89._0_4_ = fVar129 * fVar73;
              auVar89._4_4_ = fVar132 * fVar79;
              auVar89._8_4_ = fVar133 * fVar81;
              auVar89._12_4_ = fVar134 * fVar83;
              auVar85 = vsubps_avx(auVar89,auVar65);
              auVar69 = vandps_avx(auVar63,auVar43);
              auVar84 = vandps_avx(auVar63,auVar65);
              auVar69 = vcmpps_avx(auVar69,auVar84,1);
              local_1368 = vblendvps_avx(auVar85,auVar41,auVar69);
              auVar44._0_4_ = fVar136 * fVar73;
              auVar44._4_4_ = fVar140 * fVar79;
              auVar44._8_4_ = fVar142 * fVar81;
              auVar44._12_4_ = fVar144 * fVar83;
              auVar54._0_4_ = fVar136 * fVar51;
              auVar54._4_4_ = fVar140 * fVar57;
              auVar54._8_4_ = fVar142 * fVar38;
              auVar54._12_4_ = fVar144 * fVar39;
              auVar66._0_4_ = fVar119 * fVar135;
              auVar66._4_4_ = fVar121 * fVar139;
              auVar66._8_4_ = fVar122 * fVar141;
              auVar66._12_4_ = fVar123 * fVar143;
              auVar41 = vsubps_avx(auVar54,auVar66);
              auVar91._0_4_ = fVar119 * fVar40;
              auVar91._4_4_ = fVar121 * fVar48;
              auVar91._8_4_ = fVar122 * fVar49;
              auVar91._12_4_ = fVar123 * fVar50;
              auVar85 = vsubps_avx(auVar91,auVar44);
              auVar69 = vandps_avx(auVar63,auVar66);
              auVar84 = vandps_avx(auVar63,auVar44);
              auVar69 = vcmpps_avx(auVar69,auVar84,1);
              local_1358 = vblendvps_avx(auVar85,auVar41,auVar69);
              auVar35._0_4_ = fVar129 * fVar40;
              auVar35._4_4_ = fVar132 * fVar48;
              auVar35._8_4_ = fVar133 * fVar49;
              auVar35._12_4_ = fVar134 * fVar50;
              auVar55._0_4_ = fVar129 * fVar135;
              auVar55._4_4_ = fVar132 * fVar139;
              auVar55._8_4_ = fVar133 * fVar141;
              auVar55._12_4_ = fVar134 * fVar143;
              auVar67._0_4_ = fVar145 * fVar136;
              auVar67._4_4_ = fVar146 * fVar140;
              auVar67._8_4_ = fVar147 * fVar142;
              auVar67._12_4_ = fVar148 * fVar144;
              auVar92._0_4_ = fVar136 * fVar124;
              auVar92._4_4_ = fVar140 * fVar126;
              auVar92._8_4_ = fVar142 * fVar127;
              auVar92._12_4_ = fVar144 * fVar128;
              auVar41 = vsubps_avx(auVar55,auVar67);
              auVar85 = vsubps_avx(auVar92,auVar35);
              auVar69 = vandps_avx(auVar63,auVar67);
              auVar84 = vandps_avx(auVar63,auVar35);
              auVar69 = vcmpps_avx(auVar69,auVar84,1);
              local_1348 = vblendvps_avx(auVar85,auVar41,auVar69);
              fVar51 = local_1368._0_4_ * fStack_1540 +
                       local_1358._0_4_ * local_1568._4_4_ + local_1348._0_4_ * local_1558._4_4_;
              fVar40 = local_1368._4_4_ * fStack_1540 +
                       local_1358._4_4_ * local_1568._4_4_ + local_1348._4_4_ * local_1558._4_4_;
              fVar57 = local_1368._8_4_ * fStack_1540 +
                       local_1358._8_4_ * local_1568._4_4_ + local_1348._8_4_ * local_1558._4_4_;
              fVar48 = local_1368._12_4_ * fStack_1540 +
                       local_1358._12_4_ * local_1568._4_4_ + local_1348._12_4_ * local_1558._4_4_;
              auVar68._0_4_ = fVar51 + fVar51;
              auVar68._4_4_ = fVar40 + fVar40;
              auVar68._8_4_ = fVar57 + fVar57;
              auVar68._12_4_ = fVar48 + fVar48;
              fVar51 = local_1368._0_4_ * fVar11 +
                       local_1358._0_4_ * fVar2 + local_1348._0_4_ * fVar114;
              fVar40 = local_1368._4_4_ * fVar13 +
                       local_1358._4_4_ * fVar12 + local_1348._4_4_ * fVar116;
              fVar58 = local_1368._8_4_ * fVar59 +
                       local_1358._8_4_ * fVar58 + local_1348._8_4_ * fVar117;
              fVar59 = local_1368._12_4_ * fVar15 +
                       local_1358._12_4_ * fVar14 + local_1348._12_4_ * fVar118;
              auVar69 = vrcpps_avx(auVar68);
              fVar2 = auVar69._0_4_;
              auVar98._0_4_ = auVar68._0_4_ * fVar2;
              fVar11 = auVar69._4_4_;
              auVar98._4_4_ = auVar68._4_4_ * fVar11;
              fVar12 = auVar69._8_4_;
              auVar98._8_4_ = auVar68._8_4_ * fVar12;
              fVar13 = auVar69._12_4_;
              auVar98._12_4_ = auVar68._12_4_ * fVar13;
              auVar105._8_4_ = 0x3f800000;
              auVar105._0_8_ = 0x3f8000003f800000;
              auVar105._12_4_ = 0x3f800000;
              auVar69 = vsubps_avx(auVar105,auVar98);
              local_1378._0_4_ = (fVar51 + fVar51) * (fVar2 + fVar2 * auVar69._0_4_);
              local_1378._4_4_ = (fVar40 + fVar40) * (fVar11 + fVar11 * auVar69._4_4_);
              local_1378._8_4_ = (fVar58 + fVar58) * (fVar12 + fVar12 * auVar69._8_4_);
              local_1378._12_4_ = (fVar59 + fVar59) * (fVar13 + fVar13 * auVar69._12_4_);
              uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar93._4_4_ = uVar3;
              auVar93._0_4_ = uVar3;
              auVar93._8_4_ = uVar3;
              auVar93._12_4_ = uVar3;
              auVar69 = vcmpps_avx(auVar93,local_1378,2);
              fVar2 = ray->tfar;
              auVar99._4_4_ = fVar2;
              auVar99._0_4_ = fVar2;
              auVar99._8_4_ = fVar2;
              auVar99._12_4_ = fVar2;
              auVar84 = vcmpps_avx(local_1378,auVar99,2);
              auVar69 = vandps_avx(auVar69,auVar84);
              auVar84 = vcmpps_avx(auVar68,_DAT_01f7aa10,4);
              auVar69 = vandps_avx(auVar84,auVar69);
              auVar84 = vpand_avx(local_1448,local_1458);
              auVar69 = vpslld_avx(auVar69,0x1f);
              auVar69 = vpsrad_avx(auVar69,0x1f);
              local_13a8 = vpand_avx(auVar69,auVar84);
              uVar25 = vmovmskps_avx(local_13a8);
              if (uVar25 != 0) {
                local_13e8 = local_1428;
                local_13b8 = &local_156d;
                auVar69 = vrcpps_avx(local_13c8);
                fVar2 = auVar69._0_4_;
                auVar45._0_4_ = local_13c8._0_4_ * fVar2;
                fVar11 = auVar69._4_4_;
                auVar45._4_4_ = local_13c8._4_4_ * fVar11;
                fVar12 = auVar69._8_4_;
                auVar45._8_4_ = local_13c8._8_4_ * fVar12;
                fVar13 = auVar69._12_4_;
                auVar45._12_4_ = local_13c8._12_4_ * fVar13;
                auVar56._8_4_ = 0x3f800000;
                auVar56._0_8_ = 0x3f8000003f800000;
                auVar56._12_4_ = 0x3f800000;
                auVar69 = vsubps_avx(auVar56,auVar45);
                auVar36._0_4_ = fVar2 + fVar2 * auVar69._0_4_;
                auVar36._4_4_ = fVar11 + fVar11 * auVar69._4_4_;
                auVar36._8_4_ = fVar12 + fVar12 * auVar69._8_4_;
                auVar36._12_4_ = fVar13 + fVar13 * auVar69._12_4_;
                auVar46._8_4_ = 0x219392ef;
                auVar46._0_8_ = 0x219392ef219392ef;
                auVar46._12_4_ = 0x219392ef;
                auVar69 = vcmpps_avx(local_1438,auVar46,5);
                auVar69 = vandps_avx(auVar69,auVar36);
                auVar47._0_4_ = local_1428._0_4_ * auVar69._0_4_;
                auVar47._4_4_ = local_1428._4_4_ * auVar69._4_4_;
                auVar47._8_4_ = local_1428._8_4_ * auVar69._8_4_;
                auVar47._12_4_ = local_1428._12_4_ * auVar69._12_4_;
                local_1398 = vminps_avx(auVar47,auVar56);
                auVar37._0_4_ = local_13d8._0_4_ * auVar69._0_4_;
                auVar37._4_4_ = local_13d8._4_4_ * auVar69._4_4_;
                auVar37._8_4_ = local_13d8._8_4_ * auVar69._8_4_;
                auVar37._12_4_ = local_13d8._12_4_ * auVar69._12_4_;
                local_1388 = vminps_avx(auVar37,auVar56);
                uVar23 = (ulong)(uVar25 & 0xff);
                do {
                  uVar26 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  local_14a0 = *(uint *)((long)&local_13f8 + uVar26 * 4);
                  pGVar10 = (local_1530->geometries).items[local_14a0].ptr;
                  if ((pGVar10->mask & ray->mask) == 0) {
                    uVar23 = uVar23 ^ 1L << (uVar26 & 0x3f);
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002e5c22;
                    local_1548 = context->args;
                    local_14f8._0_8_ = uVar23;
                    local_14e8._0_8_ = uVar29;
                    local_14d8._0_8_ = puVar28;
                    local_1558 = context;
                    local_1488.context = context->user;
                    local_14b8 = *(undefined4 *)(local_1368 + uVar26 * 4);
                    local_14b4 = *(undefined4 *)(local_1358 + uVar26 * 4);
                    local_14b0 = *(undefined4 *)(local_1348 + uVar26 * 4);
                    local_14ac = *(undefined4 *)(local_1398 + uVar26 * 4);
                    local_14a8 = *(undefined4 *)(local_1388 + uVar26 * 4);
                    local_14a4 = *(undefined4 *)((long)&local_1408 + uVar26 * 4);
                    local_149c = (local_1488.context)->instID[0];
                    local_1498 = (local_1488.context)->instPrimID[0];
                    local_1518._0_4_ = ray->tfar;
                    local_1508._0_8_ = uVar26;
                    ray->tfar = *(float *)(local_1378 + uVar26 * 4);
                    local_156c = -1;
                    local_1488.valid = &local_156c;
                    local_1488.geometryUserPtr = pGVar10->userPtr;
                    local_1568 = ray;
                    local_1488.hit = (RTCHitN *)&local_14b8;
                    local_1488.N = 1;
                    local_1528._0_8_ = pGVar10;
                    local_1488.ray = (RTCRayN *)ray;
                    if ((pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar10->occlusionFilterN)(&local_1488), *local_1488.valid != 0)) {
                      ray = local_1568;
                      if ((local_1548->filter == (RTCFilterFunctionN)0x0) ||
                         (((local_1548->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(local_1528._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_002e5c22:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      (*local_1548->filter)(&local_1488);
                      ray = local_1568;
                      if (*local_1488.valid != 0) goto LAB_002e5c22;
                    }
                    local_1568->tfar = (float)local_1518._0_4_;
                    uVar23 = local_14f8._0_8_ ^ 1L << (local_1508._0_8_ & 0x3f);
                    ray = local_1568;
                    context = local_1558;
                    puVar28 = (ulong *)local_14d8._0_8_;
                    uVar29 = local_14e8._0_8_;
                  }
                } while (uVar23 != 0);
              }
            }
            local_14c0 = local_14c0 + 1;
            auVar100 = ZEXT3264(local_11f8);
            auVar106 = ZEXT3264(local_1218);
            auVar113 = ZEXT3264(local_1238);
            auVar115 = ZEXT3264(local_1258);
            auVar120 = ZEXT3264(local_1278);
            auVar125 = ZEXT3264(local_1298);
            auVar131 = ZEXT3264(local_12b8);
            auVar77 = ZEXT3264(local_12d8);
            auVar70 = ZEXT3264(local_12f8);
            auVar90 = ZEXT3264(local_1318);
            auVar94 = ZEXT3264(local_1338);
          } while (local_14c0 != local_14c8);
        }
LAB_002e5c12:
      } while (puVar28 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }